

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

Abc_Cex_t * Ssw_SmlGetCounterExample(Ssw_Sml_t *p)

{
  int i;
  int iVar1;
  uint uVar2;
  Aig_Obj_t *pObj;
  ulong uVar3;
  Abc_Cex_t *p_00;
  void *pvVar4;
  int iVar5;
  uint uVar6;
  Abc_Cex_t *format;
  Aig_Man_t *pAVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int local_48;
  
  if (p->fNonConstOut == 0) {
    __assert_fail("p->fNonConstOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSim.c"
                  ,0x542,"Abc_Cex_t *Ssw_SmlGetCounterExample(Ssw_Sml_t *)");
  }
  local_48 = -1;
  for (iVar8 = 0; iVar8 < p->pAig->nTruePos; iVar8 = iVar8 + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,iVar8);
    iVar1 = Ssw_SmlNodeIsZero(p,pObj);
    if (iVar1 == 0) {
      uVar3 = (ulong)p->nWordsPref;
      goto LAB_0056ef7e;
    }
  }
LAB_0056ef8f:
  iVar1 = -1;
LAB_0056efb8:
  pAVar7 = p->pAig;
  iVar10 = pAVar7->nRegs;
  if (pAVar7->nObjs[3] - iVar10 <= iVar8) {
    __assert_fail("iPo < Aig_ManCoNum(p->pAig)-Aig_ManRegNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSim.c"
                  ,0x556,"Abc_Cex_t *Ssw_SmlGetCounterExample(Ssw_Sml_t *)");
  }
  if (p->nFrames <= local_48) {
    __assert_fail("iFrame < p->nFrames",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSim.c"
                  ,0x557,"Abc_Cex_t *Ssw_SmlGetCounterExample(Ssw_Sml_t *)");
  }
  if (p->nWordsFrame * 0x20 <= iVar1) {
    __assert_fail("iBit < 32 * p->nWordsFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSim.c"
                  ,0x558,"Abc_Cex_t *Ssw_SmlGetCounterExample(Ssw_Sml_t *)");
  }
  p_00 = Abc_CexAlloc(iVar10,pAVar7->nObjs[2] - iVar10,local_48 + 1);
  p_00->iPo = iVar8;
  p_00->iFrame = local_48;
  uVar2 = 1 << ((byte)iVar1 & 0x1f);
  for (uVar9 = 0; pAVar7 = p->pAig, (int)uVar9 < pAVar7->nRegs; uVar9 = uVar9 + 1) {
    pvVar4 = Vec_PtrEntry(pAVar7->vCis,pAVar7->nTruePis + uVar9);
    if ((*(uint *)((long)&p[1].pAig +
                  (long)p->nWordsTotal * (long)*(int *)((long)pvVar4 + 0x24) * 4 +
                  (long)(iVar1 >> 5) * 4) & uVar2) != 0) {
      (&p_00[1].iPo)[uVar9 >> 5] = (&p_00[1].iPo)[uVar9 >> 5] | 1 << ((byte)uVar9 & 0x1f);
    }
  }
  for (iVar8 = 0; iVar8 <= local_48; iVar8 = iVar8 + 1) {
    for (iVar10 = 0; iVar10 < pAVar7->nTruePis; iVar10 = iVar10 + 1) {
      pvVar4 = Vec_PtrEntry(pAVar7->vCis,iVar10);
      if ((*(uint *)((long)&p[1].pAig +
                    (long)(p->nWordsFrame * iVar8 * 0x20 + iVar1 >> 5) * 4 +
                    (long)p->nWordsTotal * (long)*(int *)((long)pvVar4 + 0x24) * 4) & uVar2) != 0) {
        iVar5 = p_00->nPis * iVar8 + p_00->nRegs + iVar10;
        (&p_00[1].iPo)[iVar5 >> 5] = (&p_00[1].iPo)[iVar5 >> 5] | 1 << ((byte)iVar5 & 0x1f);
      }
      pAVar7 = p->pAig;
    }
  }
  format = p_00;
  iVar8 = Saig_ManVerifyCex(pAVar7,p_00);
  if (iVar8 == 0) {
    Abc_Print((int)pAVar7,(char *)format);
    Abc_CexFree(p_00);
    p_00 = (Abc_Cex_t *)0x0;
  }
  return p_00;
LAB_0056ef7e:
  if ((long)p->nWordsTotal <= (long)uVar3) goto LAB_0056ef8f;
  uVar9 = *(uint *)((long)&p[1].pAig + uVar3 * 4 + (long)(pObj->Id * p->nWordsTotal) * 4);
  if (uVar9 != 0) {
    uVar3 = (ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff;
    local_48 = (int)((long)uVar3 / (long)p->nWordsFrame);
    for (uVar2 = 0;
        (uVar6 = 0xffffffff, uVar2 != 0x20 && (uVar6 = uVar2, (uVar9 >> (uVar2 & 0x1f) & 1) == 0));
        uVar2 = uVar2 + 1) {
    }
    iVar1 = uVar6 + (int)((long)uVar3 % (long)p->nWordsFrame) * 0x20;
    goto LAB_0056efb8;
  }
  uVar3 = uVar3 + 1;
  goto LAB_0056ef7e;
}

Assistant:

Abc_Cex_t * Ssw_SmlGetCounterExample( Ssw_Sml_t * p )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj;
    unsigned * pSims;
    int iPo, iFrame, iBit, i, k;

    // make sure the simulation manager has it
    assert( p->fNonConstOut );

    // find the first output that failed
    iPo = -1;
    iBit = -1;
    iFrame = -1;
    Saig_ManForEachPo( p->pAig, pObj, iPo )
    {
        if ( Ssw_SmlNodeIsZero(p, pObj) )
            continue;
        pSims = Ssw_ObjSim( p, pObj->Id );
        for ( i = p->nWordsPref; i < p->nWordsTotal; i++ )
            if ( pSims[i] )
            {
                iFrame = i / p->nWordsFrame;
                iBit = 32 * (i % p->nWordsFrame) + Aig_WordFindFirstBit( pSims[i] );
                break;
            }
        break;
    }
    assert( iPo < Aig_ManCoNum(p->pAig)-Aig_ManRegNum(p->pAig) );
    assert( iFrame < p->nFrames );
    assert( iBit < 32 * p->nWordsFrame );

    // allocate the counter example
    pCex = Abc_CexAlloc( Aig_ManRegNum(p->pAig), Aig_ManCiNum(p->pAig) - Aig_ManRegNum(p->pAig), iFrame + 1 );
    pCex->iPo    = iPo;
    pCex->iFrame = iFrame;

    // copy the bit data
    Saig_ManForEachLo( p->pAig, pObj, k )
    {
        pSims = Ssw_ObjSim( p, pObj->Id );
        if ( Abc_InfoHasBit( pSims, iBit ) )
            Abc_InfoSetBit( pCex->pData, k );
    }
    for ( i = 0; i <= iFrame; i++ )
    {
        Saig_ManForEachPi( p->pAig, pObj, k )
        {
            pSims = Ssw_ObjSim( p, pObj->Id );
            if ( Abc_InfoHasBit( pSims, 32 * p->nWordsFrame * i + iBit ) )
                Abc_InfoSetBit( pCex->pData, pCex->nRegs + pCex->nPis * i + k );
        }
    }
    // verify the counter example
    if ( !Saig_ManVerifyCex( p->pAig, pCex ) )
    {
        Abc_Print( 1, "Ssw_SmlGetCounterExample(): Counter-example is invalid.\n" );
        Abc_CexFree( pCex );
        pCex = NULL;
    }
    return pCex;
}